

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  stbi__uint32 sVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  stbi_uc *__dest;
  byte bVar18;
  uint uVar19;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  byte *pbVar31;
  stbi_uc *psVar32;
  long in_FS_OFFSET;
  bool bVar33;
  long local_100;
  uint local_f4;
  ulong local_88;
  ulong uVar20;
  
  bVar33 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar33;
  uVar28 = (ulong)uVar6;
  a_00 = a->s->img_n;
  lVar29 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar33,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    pcVar12 = "outofmem";
  }
  else {
    iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar7 == 0) {
      pcVar12 = "too large";
    }
    else {
      uVar8 = a_00 * x;
      uVar19 = uVar8 * depth + 7 >> 3;
      uVar20 = (ulong)uVar19;
      if (raw_len < (uVar19 + 1) * y) {
        pcVar12 = "not enough pixels";
      }
      else {
        uVar19 = uVar5 - uVar19;
        if (7 < depth) {
          uVar19 = 0;
        }
        uVar22 = (ulong)uVar19;
        lVar26 = (long)(out_n << bVar33);
        lVar24 = -lVar26;
        lVar23 = uVar22 - uVar28;
        uVar19 = 0;
        uVar16 = 0;
        local_88 = (ulong)x;
        local_f4 = a_00 << bVar33;
        while( true ) {
          if (uVar16 == y) {
            if (depth < 8) {
              uVar19 = 0;
              for (uVar28 = 0; uVar28 != y; uVar28 = uVar28 + 1) {
                bVar4 = 1;
                if (color == 0) {
                  bVar4 = ""[depth];
                }
                uVar22 = (ulong)uVar19;
                psVar9 = a->out;
                uVar16 = (ulong)(uVar6 * (int)uVar28);
                if (depth == 4) {
                  lVar29 = (uVar5 - uVar20) + uVar22;
                  lVar23 = 0;
                  for (uVar25 = uVar8; 1 < (int)uVar25; uVar25 = uVar25 - 2) {
                    psVar9[lVar23 * 2 + uVar22] = (psVar9[lVar23 + lVar29] >> 4) * bVar4;
                    psVar9[lVar23 * 2 + uVar22 + 1] = (psVar9[lVar23 + lVar29] & 0xf) * bVar4;
                    lVar23 = lVar23 + 1;
                  }
                  if (uVar25 == 1) {
                    psVar9[lVar23 * 2 + uVar22] = (psVar9[lVar23 + lVar29] >> 4) * bVar4;
                  }
                }
                else {
                  pbVar31 = psVar9 + ((uVar5 + uVar16) - uVar20);
                  if (depth == 2) {
                    psVar9 = psVar9 + uVar22 + 3;
                    for (uVar25 = uVar8; 3 < (int)uVar25; uVar25 = uVar25 - 4) {
                      psVar9[-3] = (*pbVar31 >> 6) * bVar4;
                      psVar9[-2] = (*pbVar31 >> 4 & 3) * bVar4;
                      psVar9[-1] = (*pbVar31 >> 2 & 3) * bVar4;
                      *psVar9 = (*pbVar31 & 3) * bVar4;
                      pbVar31 = pbVar31 + 1;
                      psVar9 = psVar9 + 4;
                    }
                    if (((0 < (int)uVar25) && (psVar9[-3] = (*pbVar31 >> 6) * bVar4, uVar25 != 1))
                       && (psVar9[-2] = (*pbVar31 >> 4 & 3) * bVar4, uVar25 == 3)) {
                      psVar9[-1] = (*pbVar31 >> 2 & 3) * bVar4;
                    }
                  }
                  else if (depth == 1) {
                    pbVar10 = psVar9 + uVar22 + 7;
                    for (uVar25 = uVar8; 7 < (int)uVar25; uVar25 = uVar25 - 8) {
                      pbVar10[-7] = (char)*pbVar31 >> 7 & bVar4;
                      pbVar10[-6] = (char)(*pbVar31 * '\x02') >> 7 & bVar4;
                      pbVar10[-5] = (char)(*pbVar31 << 2) >> 7 & bVar4;
                      pbVar10[-4] = (char)(*pbVar31 << 3) >> 7 & bVar4;
                      pbVar10[-3] = (char)(*pbVar31 << 4) >> 7 & bVar4;
                      pbVar10[-2] = (char)(*pbVar31 << 5) >> 7 & bVar4;
                      pbVar10[-1] = (char)(*pbVar31 << 6) >> 7 & bVar4;
                      bVar18 = bVar4;
                      if ((*pbVar31 & 1) == 0) {
                        bVar18 = 0;
                      }
                      *pbVar10 = bVar18;
                      pbVar31 = pbVar31 + 1;
                      pbVar10 = pbVar10 + 8;
                    }
                    if (((((0 < (int)uVar25) &&
                          (pbVar10[-7] = (char)*pbVar31 >> 7 & bVar4, uVar25 != 1)) &&
                         ((pbVar10[-6] = (char)(*pbVar31 * '\x02') >> 7 & bVar4, 2 < uVar25 &&
                          ((pbVar10[-5] = (char)(*pbVar31 << 2) >> 7 & bVar4, uVar25 != 3 &&
                           (pbVar10[-4] = (char)(*pbVar31 << 3) >> 7 & bVar4, 4 < uVar25)))))) &&
                        (pbVar10[-3] = (char)(*pbVar31 << 4) >> 7 & bVar4, uVar25 != 5)) &&
                       (pbVar10[-2] = (char)(*pbVar31 << 5) >> 7 & bVar4, uVar25 == 7)) {
                      pbVar10[-1] = (char)(*pbVar31 << 6) >> 7 & bVar4;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar9 = a->out;
                  iVar7 = x - 1;
                  uVar17 = x * 4;
                  uVar25 = x * 3;
                  if (a_00 == 1) {
                    uVar25 = x * 2 - 1;
                    for (iVar7 = 0; -1 < (int)((x - 1) + iVar7); iVar7 = iVar7 + -1) {
                      psVar9[uVar25 + uVar16] = 0xff;
                      psVar9[(uVar25 - 1) + uVar16] =
                           psVar9[((x - 1) + iVar7 & 0x7fffffff) + uVar16];
                      uVar25 = uVar25 - 2;
                    }
                  }
                  else {
                    while( true ) {
                      uVar25 = uVar25 - 3;
                      if (iVar7 < 0) break;
                      psVar9[(uVar17 - 1) + uVar16] = 0xff;
                      psVar9[(uVar17 - 2) + uVar16] = psVar9[(ulong)uVar25 + uVar16 + 2];
                      psVar9[(uVar17 - 3) + uVar16] = psVar9[(ulong)uVar25 + uVar16 + 1];
                      psVar9[(uVar17 - 4) + uVar16] = psVar9[uVar25 + uVar16];
                      iVar7 = iVar7 + -1;
                      uVar17 = uVar17 - 4;
                    }
                  }
                }
                uVar19 = uVar19 + uVar6;
              }
            }
            else if (depth == 0x10) {
              psVar9 = a->out;
              for (lVar29 = 0; uVar5 * y != (int)lVar29; lVar29 = lVar29 + 1) {
                puVar1 = (ushort *)(psVar9 + lVar29 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
            }
            return 1;
          }
          uVar15 = (ulong)*raw;
          if (4 < uVar15) break;
          uVar25 = local_f4;
          if (depth < 8) {
            uVar25 = 1;
            local_88 = uVar20;
          }
          if (uVar16 == 0) {
            uVar15 = (ulong)""[uVar15];
          }
          uVar21 = (ulong)uVar19;
          psVar9 = a->out;
          uVar17 = uVar6 * (int)uVar16;
          uVar30 = 0;
          if (0 < (int)uVar25) {
            uVar30 = (ulong)uVar25;
          }
          lVar13 = -uVar28 + uVar21 + uVar22;
          for (uVar27 = 0; uVar30 != uVar27; uVar27 = uVar27 + 1) {
            switch(uVar15) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar27 + 1];
              break;
            case 2:
              bVar4 = psVar9[uVar27 + lVar13];
              goto LAB_00140b89;
            case 3:
              bVar4 = psVar9[uVar27 + lVar13] >> 1;
LAB_00140b89:
              bVar4 = bVar4 + raw[uVar27 + 1];
              break;
            case 4:
              bVar4 = raw[uVar27 + 1];
              iVar7 = stbi__paeth(0,(uint)psVar9[uVar27 + lVar13],0);
              bVar4 = (char)iVar7 + bVar4;
              break;
            default:
              goto switchD_00140b40_default;
            }
            psVar9[uVar27 + uVar21 + uVar22] = bVar4;
switchD_00140b40_default:
          }
          lVar13 = (long)(int)local_f4;
          if (depth == 8) {
            lVar14 = (long)out_n;
            lVar2 = lVar29;
            if (a_00 != out_n) {
              psVar9[lVar29 + (ulong)uVar17] = 0xff;
            }
LAB_00140bf1:
            raw = raw + lVar2 + 1;
            lVar2 = lVar14 + (ulong)uVar17;
          }
          else {
            if (depth == 0x10) {
              lVar14 = lVar26;
              lVar2 = lVar13;
              if (a_00 != out_n) {
                (psVar9 + lVar13 + (ulong)uVar17)[0] = 0xff;
                (psVar9 + lVar13 + (ulong)uVar17)[1] = 0xff;
              }
              goto LAB_00140bf1;
            }
            raw = raw + 2;
            lVar2 = uVar22 + uVar17 + 1;
            lVar14 = 1;
          }
          __dest = psVar9 + lVar2;
          if (a_00 == out_n || depth < 8) {
            uVar17 = ((int)local_88 + -1) * uVar25;
            if ((byte)uVar15 < 7) {
              lVar13 = (long)(int)uVar25;
              switch(uVar15) {
              case 0:
                memcpy(__dest,raw,(long)(int)uVar17);
                break;
              case 1:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = __dest[uVar15 - lVar13] + raw[uVar15];
                }
                break;
              case 2:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = psVar9[uVar15 + lVar14 + uVar21 + lVar23] + raw[uVar15];
                }
                break;
              case 3:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] =
                       (char)((uint)__dest[uVar15 - lVar13] +
                              (uint)psVar9[uVar15 + lVar14 + uVar21 + lVar23] >> 1) + raw[uVar15];
                }
                break;
              case 4:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                uVar15 = (ulong)uVar3;
                pbVar10 = psVar9 + lVar14 + uVar21 + lVar23;
                pbVar31 = raw;
                while (bVar33 = uVar15 != 0, uVar15 = uVar15 - 1, bVar33) {
                  bVar4 = *pbVar31;
                  iVar7 = stbi__paeth((uint)__dest[-lVar13],(uint)*pbVar10,(uint)pbVar10[-lVar13]);
                  *__dest = (char)iVar7 + bVar4;
                  __dest = __dest + 1;
                  pbVar10 = pbVar10 + 1;
                  pbVar31 = pbVar31 + 1;
                }
                break;
              case 5:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = (__dest[uVar15 - lVar13] >> 1) + raw[uVar15];
                }
                break;
              case 6:
                uVar3 = uVar17;
                if ((int)uVar17 < 1) {
                  uVar3 = 0;
                }
                for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = __dest[uVar15 - lVar13] + raw[uVar15];
                }
              }
            }
            raw = raw + (int)uVar17;
          }
          else {
            if ((byte)uVar15 < 7) {
              psVar32 = psVar9 + lVar14 + -uVar28 + uVar22 + uVar17;
              switch(uVar15) {
              case 0:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                }
                break;
              case 1:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = __dest[uVar15 + lVar24] + raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                }
                break;
              case 2:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = psVar32[uVar15] + raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                  psVar32 = psVar32 + lVar26;
                }
                break;
              case 3:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] =
                         (char)((uint)__dest[uVar15 + lVar24] + (uint)psVar32[uVar15] >> 1) +
                         raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                  psVar32 = psVar32 + lVar26;
                }
                break;
              case 4:
                local_100 = lVar24 + (long)__dest;
                psVar9 = psVar9 + lVar14 + uVar21 + ((uVar22 - lVar26) - uVar28);
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    bVar4 = raw[uVar15];
                    iVar7 = stbi__paeth((uint)*(byte *)(local_100 + uVar15),(uint)psVar32[uVar15],
                                        (uint)psVar9[uVar15]);
                    __dest[uVar15] = (char)iVar7 + bVar4;
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                  psVar32 = psVar32 + lVar26;
                  local_100 = local_100 + lVar26;
                  psVar9 = psVar9 + lVar26;
                }
                break;
              case 5:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = (__dest[uVar15 + lVar24] >> 1) + raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                }
                break;
              case 6:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = __dest[uVar15 + lVar24] + raw[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  raw = raw + lVar13;
                  __dest = __dest + lVar26;
                }
              }
            }
            if (depth == 0x10) {
              psVar9 = a->out + (long)(int)(local_f4 + 1) + uVar21;
              sVar11 = x;
              while (bVar33 = sVar11 != 0, sVar11 = sVar11 - 1, bVar33) {
                *psVar9 = 0xff;
                psVar9 = psVar9 + lVar26;
              }
            }
          }
          uVar16 = uVar16 + 1;
          uVar19 = uVar6 + uVar19;
          local_f4 = uVar25;
        }
        pcVar12 = "invalid filter";
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar12;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }